

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O1

mu_Id mu_get_id(mu_Context *ctx,void *data,int size)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  iVar1 = (ctx->id_stack).idx;
  if (iVar1 < 1) {
    uVar2 = 0x811c9dc5;
  }
  else {
    uVar2 = (ctx->id_stack).items[iVar1 - 1];
  }
  if (size != 0) {
    lVar3 = 0;
    do {
      uVar2 = (*(byte *)((long)data + lVar3) ^ uVar2) * 0x1000193;
      lVar3 = lVar3 + 1;
    } while (size != (int)lVar3);
  }
  ctx->last_id = uVar2;
  return uVar2;
}

Assistant:

mu_Id mu_get_id(mu_Context *ctx, const void *data, int size) {
  int idx = ctx->id_stack.idx;
  mu_Id res = (idx > 0) ? ctx->id_stack.items[idx - 1] : HASH_INITIAL;
  hash(&res, data, size);
  ctx->last_id = res;
  return res;
}